

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testReader.cpp
# Opt level: O1

int test(lefrCallbackType_e type,lefiMacro *pModel,void *pData)

{
  int iVar1;
  long *plVar2;
  ostream *poVar3;
  char *pcVar4;
  size_t sVar5;
  bool bVar6;
  double dVar7;
  lefiPin tpin;
  char local_2fd;
  int local_2fc;
  lefiPin local_2f8 [712];
  
  LefDefParser::lefiPin::lefiPin(local_2f8);
  local_2fc = LefDefParser::lefiMacro::numProperties(pModel);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Call test",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"type",4);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,type);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  poVar3 = (ostream *)std::ostream::flush();
  pcVar4 = (char *)LefDefParser::lefiMacro::name(pModel);
  if (pcVar4 == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar5 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,sVar5);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  pcVar4 = (char *)LefDefParser::lefiMacro::macroClass(pModel);
  if (pcVar4 == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar5 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,sVar5);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  pcVar4 = (char *)LefDefParser::lefiMacro::clockType(pModel);
  if (pcVar4 == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar5 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,sVar5);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  pcVar4 = (char *)LefDefParser::lefiMacro::foreignName(pModel,0);
  if (pcVar4 == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar5 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,sVar5);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  pcVar4 = (char *)LefDefParser::lefiMacro::generator(pModel);
  if (pcVar4 == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar5 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,sVar5);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  iVar1 = LefDefParser::lefiMacro::hasSize(pModel);
  plVar2 = (long *)std::ostream::operator<<(poVar3,iVar1);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  if (local_2fc != 0) {
    bVar6 = true;
    iVar1 = 0;
    while (iVar1 < local_2fc) {
      if (!bVar6) {
        __assert_fail("i < 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/test/testReader.cpp"
                      ,0x19,"int test(lefrCallbackType_e, lefiMacro *, void *)");
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"[Property Name]",0xf);
      pcVar4 = (char *)LefDefParser::lefiMacro::propName(pModel,0);
      if (pcVar4 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1a31e0);
      }
      else {
        sVar5 = strlen(pcVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,sVar5);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      std::ostream::put(-0x20);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[Property Num]",0xe);
      dVar7 = (double)LefDefParser::lefiMacro::propNum(pModel,0);
      poVar3 = std::ostream::_M_insert<double>(dVar7);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[Property Type]",0xf);
      local_2fd = LefDefParser::lefiMacro::propType(pModel,0);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_2fd,1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      bVar6 = false;
      std::ostream::flush();
      iVar1 = 1;
    }
  }
  LefDefParser::lefiPin::~lefiPin(local_2f8);
  return 0;
}

Assistant:

int test(lefrCallbackType_e type, lefiMacro *pModel, lefiUserData pData) {
    auto & model = *pModel;
    auto & data = *(int *)pData;
    lefiPin tpin;
    int numProps = model.numProperties();
    //std::cout << numProps << std::endl;
    std ::cout<<"Call test"<< std::endl;
    std::cout << "type" << type << std::endl
        <<model.name()<<std::endl
        <<model.macroClass() << std::endl
        <<model.clockType() << std::endl
        <<model.foreignName() << std::endl
        <<model.generator() << std::endl
        <<model.hasSize() << std::endl;
    int i, j =numProps;
    if( numProps == 0)return 0;
    for (i = 0;i < numProps;i++) {
        assert(i < 1);
        std::cout << "[Property Name]" << (model.propName(i)) << std::endl
                  << "[Property Num]" << model.propNum(i) << std::endl
                  << "[Property Type]" << model.propType(i) << std::endl;
    }
    return 0;
}